

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O0

void __thiscall
Assimp::LWO::AnimResolver::AnimResolver
          (AnimResolver *this,
          list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *_envelopes,
          double tick)

{
  iterator iVar1;
  bool bVar2;
  reference pEVar3;
  size_type sVar4;
  reference pKVar5;
  reference pvVar6;
  double *pdVar7;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_40;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_38;
  iterator d;
  _Self local_28;
  iterator it;
  double tick_local;
  list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *_envelopes_local;
  AnimResolver *this_local;
  
  this->envelopes = _envelopes;
  this->sample_rate = 0.0;
  this->envl_x = (Envelope *)0x0;
  this->envl_y = (Envelope *)0x0;
  this->envl_z = (Envelope *)0x0;
  it._M_node = (_List_node_base *)tick;
  __gnu_cxx::
  __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  ::__normal_iterator(&this->cur_x);
  __gnu_cxx::
  __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  ::__normal_iterator(&this->cur_y);
  __gnu_cxx::
  __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  ::__normal_iterator(&this->cur_z);
  this->end_x = false;
  this->end_y = false;
  this->end_z = false;
  this->flags = 0;
  this->sample_delta = 0.0;
  this->trans_z = (Envelope *)0x0;
  this->trans_y = (Envelope *)0x0;
  this->trans_x = (Envelope *)0x0;
  this->rotat_z = (Envelope *)0x0;
  this->rotat_y = (Envelope *)0x0;
  this->rotat_x = (Envelope *)0x0;
  this->scale_z = (Envelope *)0x0;
  this->scale_y = (Envelope *)0x0;
  this->scale_x = (Envelope *)0x0;
  this->last = 150392.0;
  this->first = 150392.0;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::begin
                 (this->envelopes);
  do {
    d._M_current = (Key *)std::__cxx11::
                          list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::end
                                    (this->envelopes);
    bVar2 = std::operator!=(&local_28,(_Self *)&d);
    if (!bVar2) {
      this->need_to_setup = true;
      return;
    }
    pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
    pEVar3->old_first = 0;
    pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
    sVar4 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size(&pEVar3->keys);
    pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
    pEVar3->old_last = sVar4 - 1;
    pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
    bVar2 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::empty(&pEVar3->keys);
    if (!bVar2) {
      pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
      switch(pEVar3->type) {
      case EnvelopeType_Position_X:
        pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
        this->trans_x = pEVar3;
        break;
      case EnvelopeType_Position_Y:
        pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
        this->trans_y = pEVar3;
        break;
      case EnvelopeType_Position_Z:
        pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
        this->trans_z = pEVar3;
        break;
      case EnvelopeType_Rotation_Heading:
        pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
        this->rotat_x = pEVar3;
        break;
      case EnvelopeType_Rotation_Pitch:
        pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
        this->rotat_y = pEVar3;
        break;
      case EnvelopeType_Rotation_Bank:
        pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
        this->rotat_z = pEVar3;
        break;
      case EnvelopeType_Scaling_X:
        pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
        this->scale_x = pEVar3;
        break;
      case EnvelopeType_Scaling_Y:
        pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
        this->scale_y = pEVar3;
        break;
      case EnvelopeType_Scaling_Z:
        pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
        this->scale_z = pEVar3;
        break;
      default:
        goto switchD_00b14b53_default;
      }
      pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
      local_38._M_current =
           (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::begin
                            (&pEVar3->keys);
      while( true ) {
        pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
        local_40._M_current =
             (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::end
                              (&pEVar3->keys);
        bVar2 = __gnu_cxx::operator!=(&local_38,&local_40);
        iVar1 = it;
        if (!bVar2) break;
        pKVar5 = __gnu_cxx::
                 __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                 ::operator*(&local_38);
        pKVar5->time = (double)iVar1._M_node * pKVar5->time;
        __gnu_cxx::
        __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
        ::operator++(&local_38);
      }
      pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
      pvVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::front
                         (&pEVar3->keys);
      pdVar7 = std::min<double>(&this->first,&pvVar6->time);
      this->first = *pdVar7;
      pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_28);
      pvVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::back(&pEVar3->keys)
      ;
      pdVar7 = std::max<double>(&this->last,&pvVar6->time);
      this->last = *pdVar7;
    }
switchD_00b14b53_default:
    std::_List_iterator<Assimp::LWO::Envelope>::operator++(&local_28);
  } while( true );
}

Assistant:

AnimResolver::AnimResolver(std::list<Envelope>& _envelopes,double tick)
    : envelopes   (_envelopes)
    , sample_rate (0.)
    , envl_x(), envl_y(), envl_z()
    , end_x(), end_y(), end_z()
    , flags()
    , sample_delta()
{
    trans_x = trans_y = trans_z = NULL;
    rotat_x = rotat_y = rotat_z = NULL;
    scale_x = scale_y = scale_z = NULL;

    first = last = 150392.;

    // find transformation envelopes
    for (std::list<LWO::Envelope>::iterator it = envelopes.begin(); it != envelopes.end(); ++it) {

        (*it).old_first = 0;
        (*it).old_last  = (*it).keys.size()-1;

        if ((*it).keys.empty()) continue;
        switch ((*it).type) {

            // translation
            case LWO::EnvelopeType_Position_X:
                trans_x = &*it;break;
            case LWO::EnvelopeType_Position_Y:
                trans_y = &*it;break;
            case LWO::EnvelopeType_Position_Z:
                trans_z = &*it;break;

                // rotation
            case LWO::EnvelopeType_Rotation_Heading:
                rotat_x = &*it;break;
            case LWO::EnvelopeType_Rotation_Pitch:
                rotat_y = &*it;break;
            case LWO::EnvelopeType_Rotation_Bank:
                rotat_z = &*it;break;

                // scaling
            case LWO::EnvelopeType_Scaling_X:
                scale_x = &*it;break;
            case LWO::EnvelopeType_Scaling_Y:
                scale_y = &*it;break;
            case LWO::EnvelopeType_Scaling_Z:
                scale_z = &*it;break;
            default:
                continue;
        };

        // convert from seconds to ticks
        for (std::vector<LWO::Key>::iterator d = (*it).keys.begin(); d != (*it).keys.end(); ++d)
            (*d).time *= tick;

        // set default animation range (minimum and maximum time value for which we have a keyframe)
        first = std::min(first, (*it).keys.front().time );
        last  = std::max(last,  (*it).keys.back().time );
    }

    // deferred setup of animation range to increase performance.
    // typically the application will want to specify its own.
    need_to_setup = true;
}